

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  IntruleType *this_00;
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  int64_t nelem;
  TPZConnect *pTVar5;
  TPZGeoEl *this_01;
  long *plVar6;
  undefined1 auVar7 [16];
  int order_1;
  TPZManVector<int,_3> order;
  TPZManVector<int,_3> ord;
  TPZStack<int,_10> facesides;
  int local_e4;
  TPZVec<int> local_e0;
  int local_c0;
  int local_bc;
  int local_b8;
  TPZManVector<int,_6> *local_b0;
  TPZManVector<int,_3> local_a8;
  TPZManVector<int,_10> local_78;
  long lVar8;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_019283b8;
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeCube>,&PTR_PTR_019228c0,mesh,gel,1);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_019224e8;
  TPZVec<int>::TPZVec(&(this->fSideOrient).super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01928670;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 6;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  auVar1 = _DAT_014f8350;
  lVar4 = 0x21;
  auVar7 = _DAT_014f8340;
  do {
    if (SUB164(auVar7 ^ auVar1,4) == -0x80000000 && SUB164(auVar7 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined4 *)((long)this + lVar4 * 4 + -4) = 1;
      (this->fSideOrient).fExtAlloc[lVar4 + -0x20] = 1;
    }
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar8 + 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x27);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019286c8;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 7;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 5) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x2c) = 0xffffffff;
  (this->fConnectIndexes).fExtAlloc[6] = -1;
  this->fhdivfam = hdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = mesh->fDefaultOrder;
  TPZManVector<long,_7>::Resize(&this->fConnectIndexes,7);
  gel->fReference = (TPZCompEl *)this;
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
  local_b0 = &this->fSideOrient;
  pztopology::TPZCube::LowerDimensionSides(0x1a,(TPZStack<int,_10> *)&local_78,2);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,0x1a);
  if (0 < local_78.super_TPZVec<int>.fNElements) {
    lVar4 = 0;
    do {
      iVar2 = local_78.super_TPZVec<int>.fStore[lVar4];
      nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x370))(this,iVar2);
      (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar4] = nelem;
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      pTVar5->fNElConnected = pTVar5->fNElConnected + 1;
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x378))(this,iVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_78.super_TPZVec<int>.fNElements);
  }
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(this);
  TPZVec<int>::TPZVec(&local_e0,0);
  this_00 = &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).fIntRule;
  iVar2 = iVar2 * 2 + 2;
  local_c0 = 0x14;
  if (iVar2 < 0x14) {
    local_c0 = iVar2;
  }
  local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_e0.fNElements = 3;
  local_e0.fNAlloc = 0;
  local_e0.fStore = &local_c0;
  local_bc = local_c0;
  local_b8 = local_c0;
  TPZIntCube3D::SetOrder(this_00,&local_e0,0);
  lVar4 = 0;
  do {
    this_01 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar2 = TPZGeoEl::NormalOrientation(this_01,(int)lVar4 + 0x14);
    (this->fSideOrient).super_TPZVec<int>.fStore[lVar4] = iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  lVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar4 == 0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(lVar4,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar6 != (long *)0x0) {
    uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x268))(this);
    local_e4 = (**(code **)(*plVar6 + 0x58))(plVar6,uVar3);
    iVar2 = (**(code **)(*(long *)gel + 0x210))(gel);
    TPZManVector<int,_3>::TPZManVector(&local_a8,(long)iVar2,&local_e4);
    TPZIntCube3D::SetOrder(this_00,&local_a8.super_TPZVec<int>,0);
    if (local_a8.super_TPZVec<int>.fStore == local_a8.fExtAlloc) {
      local_a8.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_a8.super_TPZVec<int>.fNAlloc = 0;
    local_a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_a8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_a8.super_TPZVec<int>.fStore);
    }
  }
  if (local_e0.fStore == &local_c0) {
    local_e0.fStore = (int *)0x0;
  }
  local_e0.fNAlloc = 0;
  local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_e0.fStore != (int *)0x0) {
    operator_delete__(local_e0.fStore);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}